

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::NullTypeHandlerBase::SetPropertyWithAttributes
          (NullTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  BOOL BVar1;
  ScriptContext *this_00;
  uint32 local_44;
  PropertyValueInfo *pPStack_40;
  uint32 indexVal;
  PropertyValueInfo *info_local;
  Var pvStack_30;
  PropertyAttributes attributes_local;
  Var value_local;
  DynamicObject *pDStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  NullTypeHandlerBase *this_local;
  
  pPStack_40 = info;
  info_local._7_1_ = attributes;
  pvStack_30 = value;
  value_local._4_4_ = propertyId;
  pDStack_20 = instance;
  instance_local = (DynamicObject *)this;
  this_00 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  BVar1 = ScriptContext::IsNumericPropertyId(this_00,value_local._4_4_,&local_44);
  if (BVar1 == 0) {
    this_local._4_4_ =
         AddProperty(this,pDStack_20,value_local._4_4_,pvStack_30,info_local._7_1_,pPStack_40,flags,
                     possibleSideEffects);
  }
  else {
    this_local._4_4_ =
         DynamicTypeHandler::SetItemWithAttributes
                   (&this->super_DynamicTypeHandler,pDStack_20,local_44,pvStack_30,info_local._7_1_)
    ;
  }
  return this_local._4_4_;
}

Assistant:

BOOL NullTypeHandlerBase::SetPropertyWithAttributes(DynamicObject* instance, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        // Always check numeric propertyId. May create objectArray.
        uint32 indexVal;
        if (instance->GetScriptContext()->IsNumericPropertyId(propertyId, &indexVal))
        {
            return NullTypeHandlerBase::SetItemWithAttributes(instance, indexVal, value, attributes);
        }

        return this->AddProperty(instance, propertyId, value, attributes, info, flags, possibleSideEffects);
    }